

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O2

int ncnn::deconvolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  float *pfVar12;
  float *extraout_RAX;
  float *extraout_RAX_00;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int i;
  ulong uVar22;
  float *pfVar23;
  ulong uVar24;
  ulong uVar25;
  int k_1;
  ulong uVar26;
  ulong uVar27;
  float *pfVar28;
  int i_1;
  int iVar29;
  void *pvVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  void *local_110;
  
  pvVar5 = bias_data->data;
  if (pvVar5 == (void *)0x0) {
    bVar31 = true;
  }
  else {
    bVar31 = (long)bias_data->c * bias_data->cstep == 0;
  }
  uVar20 = 0;
  if (0 < group) {
    uVar20 = (ulong)(uint)group;
  }
  uVar2 = bottom_blob->w;
  uVar3 = top_blob->w;
  if (top_blob->h == group && bottom_blob->h == group) {
    pfVar12 = (float *)(ulong)uVar2;
    pfVar28 = (float *)top_blob->data;
    pvVar6 = bottom_blob->data;
    sVar7 = bottom_blob->elemsize;
    pvVar30 = weight_data->data;
    uVar26 = 0;
    uVar18 = 0;
    if (0 < (int)uVar3) {
      uVar18 = (ulong)uVar3;
    }
    uVar21 = 0;
    if (0 < kernel_w) {
      uVar21 = (ulong)(uint)kernel_w;
    }
    uVar22 = 0;
    if (0 < (int)uVar2) {
      uVar22 = (ulong)uVar2;
    }
    sVar8 = top_blob->elemsize;
    for (; iVar10 = (int)pfVar12, uVar26 != uVar20; uVar26 = uVar26 + 1) {
      fVar33 = 0.0;
      if (!bVar31) {
        fVar33 = *(float *)((long)pvVar5 + uVar26 * 4);
      }
      for (lVar15 = 0; (int)uVar18 != (int)lVar15; lVar15 = lVar15 + 1) {
        pfVar28[lVar15] = fVar33;
      }
      pfVar12 = pfVar28;
      for (uVar19 = 0; uVar19 != uVar22; uVar19 = uVar19 + 1) {
        fVar33 = *(float *)((long)pvVar6 + uVar19 * 4 + (long)(int)uVar2 * sVar7 * uVar26);
        pfVar23 = pfVar12;
        for (uVar24 = 0; uVar21 != uVar24; uVar24 = uVar24 + 1) {
          *pfVar23 = *(float *)((long)pvVar30 + uVar24 * 4) * fVar33 + *pfVar23;
          pfVar23 = pfVar23 + dilation_w;
        }
        pfVar12 = pfVar12 + stride_w;
      }
      pfVar23 = (float *)activation_params->data;
      pfVar12 = pfVar23;
      for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
        fVar33 = pfVar28[uVar19];
        pfVar11 = (float *)(ulong)(activation_type - 1U);
        pfVar12 = pfVar11;
        fVar32 = fVar33;
        if (activation_type - 1U < 6) {
          pfVar12 = (float *)((long)&switchD_004ef855::switchdataD_00544c98 +
                             (long)(int)(&switchD_004ef855::switchdataD_00544c98)[(long)pfVar11]);
          switch(pfVar11) {
          case (float *)0x0:
            if (fVar33 <= 0.0) {
              fVar32 = 0.0;
            }
            break;
          case (float *)0x1:
            pfVar12 = pfVar23;
            fVar32 = (float)(~-(uint)(0.0 < fVar33) & (uint)*pfVar23 |
                            -(uint)(0.0 < fVar33) & 0x3f800000) * fVar33;
            break;
          case (float *)0x2:
            if (fVar33 <= *pfVar23) {
              fVar33 = *pfVar23;
            }
            pfVar12 = pfVar23;
            fVar32 = pfVar23[1];
            if (fVar33 <= pfVar23[1]) {
              fVar32 = fVar33;
            }
            break;
          case (float *)0x3:
            if (88.37626 <= fVar33) {
              fVar33 = 88.37626;
            }
            fVar33 = expf((float)(-(uint)(fVar33 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar33 < -88.37626) & (uint)-fVar33));
            pfVar12 = extraout_RAX_00;
            fVar32 = 1.0 / (fVar33 + 1.0);
            break;
          case (float *)0x4:
            fVar32 = expf(fVar33);
            fVar32 = logf(fVar32 + 1.0);
            fVar32 = tanhf(fVar32);
            pfVar12 = extraout_RAX;
            fVar32 = fVar32 * fVar33;
            break;
          case (float *)0x5:
            fVar1 = *pfVar23;
            fVar34 = -pfVar23[1] / fVar1;
            pfVar12 = pfVar23;
            fVar32 = 0.0;
            if ((fVar34 <= fVar33) && (fVar32 = fVar33, fVar33 <= fVar34 + 1.0 / fVar1)) {
              fVar32 = (fVar1 * fVar33 + pfVar23[1]) * fVar33;
            }
          }
        }
        pfVar28[uVar19] = fVar32;
      }
      pfVar28 = (float *)((long)pfVar28 + (long)(int)uVar3 * sVar8);
      pvVar30 = (void *)((long)pvVar30 + (long)kernel_w * 4);
    }
  }
  else {
    uVar18 = (long)bottom_blob->h / (long)group;
    uVar26 = (long)top_blob->h / (long)group;
    iVar29 = (int)uVar18;
    uVar21 = 0;
    if (0 < kernel_w) {
      uVar21 = (ulong)(uint)kernel_w;
    }
    uVar22 = 0;
    if (0 < iVar29) {
      uVar22 = uVar18 & 0xffffffff;
    }
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    uVar18 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar18 = 0;
    }
    iVar9 = (int)uVar26;
    uVar19 = 0;
    if (0 < iVar9) {
      uVar19 = uVar26 & 0xffffffff;
    }
    lVar15 = 0;
    iVar10 = 0;
    for (uVar26 = 0; uVar26 != uVar20; uVar26 = uVar26 + 1) {
      iVar4 = top_blob->w;
      iVar17 = 0;
      if (0 < iVar4) {
        iVar17 = iVar4;
      }
      lVar13 = (long)iVar4 * top_blob->elemsize;
      pfVar28 = (float *)(lVar13 * lVar15 + (long)top_blob->data);
      pvVar5 = bias_data->data;
      local_110 = (void *)((long)iVar10 * 4 + (long)weight_data->data);
      for (uVar24 = 0; uVar24 != uVar19; uVar24 = uVar24 + 1) {
        fVar33 = 0.0;
        if (!bVar31) {
          fVar33 = *(float *)((long)pvVar5 + (uVar26 * (long)iVar9 + uVar24) * 4);
        }
        for (lVar14 = 0; iVar17 != (int)lVar14; lVar14 = lVar14 + 1) {
          pfVar28[lVar14] = fVar33;
        }
        pfVar12 = pfVar28;
        for (uVar16 = 0; uVar16 != uVar2; uVar16 = uVar16 + 1) {
          iVar4 = bottom_blob->w;
          sVar7 = bottom_blob->elemsize;
          pvVar6 = bottom_blob->data;
          pvVar30 = local_110;
          for (uVar25 = 0; uVar25 != uVar22; uVar25 = uVar25 + 1) {
            fVar33 = *(float *)((long)pvVar6 +
                               (uVar25 + uVar26 * (long)iVar29) * (long)iVar4 * sVar7 + uVar16 * 4);
            pfVar23 = pfVar12;
            for (uVar27 = 0; uVar21 != uVar27; uVar27 = uVar27 + 1) {
              *pfVar23 = *(float *)((long)pvVar30 + uVar27 * 4) * fVar33 + *pfVar23;
              pfVar23 = pfVar23 + dilation_w;
            }
            pvVar30 = (void *)((long)pvVar30 + (long)kernel_w * 4);
          }
          pfVar12 = pfVar12 + stride_w;
        }
        pfVar12 = (float *)activation_params->data;
        for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
          fVar33 = pfVar28[uVar16];
          fVar32 = fVar33;
          switch(activation_type) {
          case 1:
            if (fVar33 <= 0.0) {
              fVar32 = 0.0;
            }
            break;
          case 2:
            fVar32 = (float)(~-(uint)(0.0 < fVar33) & (uint)*pfVar12 |
                            -(uint)(0.0 < fVar33) & 0x3f800000) * fVar33;
            break;
          case 3:
            if (fVar33 <= *pfVar12) {
              fVar33 = *pfVar12;
            }
            fVar32 = pfVar12[1];
            if (fVar33 <= pfVar12[1]) {
              fVar32 = fVar33;
            }
            break;
          case 4:
            if (88.37626 <= fVar33) {
              fVar33 = 88.37626;
            }
            fVar33 = expf((float)(-(uint)(fVar33 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar33 < -88.37626) & (uint)-fVar33));
            fVar32 = 1.0 / (fVar33 + 1.0);
            break;
          case 5:
            fVar32 = expf(fVar33);
            fVar32 = logf(fVar32 + 1.0);
            fVar32 = tanhf(fVar32);
            fVar32 = fVar32 * fVar33;
            break;
          case 6:
            fVar1 = *pfVar12;
            fVar34 = -pfVar12[1] / fVar1;
            fVar32 = 0.0;
            if ((fVar34 <= fVar33) && (fVar32 = fVar33, fVar33 <= fVar34 + 1.0 / fVar1)) {
              fVar32 = (fVar1 * fVar33 + pfVar12[1]) * fVar33;
            }
          }
          pfVar28[uVar16] = fVar32;
        }
        pfVar28 = (float *)((long)pfVar28 + lVar13);
        local_110 = (void *)((long)local_110 + (long)(iVar29 * kernel_w) * 4);
      }
      lVar15 = lVar15 + iVar9;
      iVar10 = iVar10 + iVar9 * iVar29 * kernel_w;
    }
  }
  return iVar10;
}

Assistant:

static int deconvolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat out = top_blob.row_range(g, 1);

            const float* inptr = bottom_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            const float bias = bias_term ? bias_data[g] : 0.f;

            out.fill(bias);

            for (int j = 0; j < w; j++)
            {
                float* outptr = (float*)out + j * stride_w;

                const float val = inptr[j];

                for (int k = 0; k < kernel_w; k++)
                {
                    float w = kptr[k];
                    outptr[k * dilation_w] += val * w;
                }
            }

            {
                float* outptr = out;

                for (int i = 0; i < outw; i++)
                {
                    outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                }
            }
        }
    }
    else
    {
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                Mat out = top_blob.row_range(g * outh_g + p, 1);

                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;
                const float bias = bias_term ? bias_data[g * outh_g + p] : 0.f;

                out.fill(bias);

                for (int j = 0; j < w; j++)
                {
                    float* outptr = (float*)out + j * stride_w;

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float val = bottom_blob.row(h_g * g + q)[j];

                        for (int k = 0; k < kernel_w; k++)
                        {
                            outptr[k * dilation_w] += val * kptr[k];
                        }

                        kptr += kernel_w;
                    }
                }

                {
                    float* outptr = out;

                    for (int i = 0; i < outw; i++)
                    {
                        outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                    }
                }
            }
        }
    }

    return 0;
}